

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
::Boundary_matrix(Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
                  *this,uint numberOfColumns,Column_settings *colSettings)

{
  int maximalDimension;
  ulong __n;
  allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>_>
  local_23;
  key_equal local_22;
  hasher local_21;
  Column_settings *local_20;
  Column_settings *colSettings_local;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  *pBStack_10;
  uint numberOfColumns_local;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  *this_local;
  
  local_20 = colSettings;
  colSettings_local._4_4_ = numberOfColumns;
  pBStack_10 = this;
  maximalDimension =
       Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>
       ::get_null_value<int>();
  Dummy_matrix_dimension_holder::Dummy_matrix_dimension_holder<int>
            ((Dummy_matrix_dimension_holder *)this,maximalDimension);
  Dummy_base_swap::Dummy_base_swap((Dummy_base_swap *)this,colSettings_local._4_4_);
  Dummy_matrix_row_access::Dummy_matrix_row_access
            ((Dummy_matrix_row_access *)this,colSettings_local._4_4_);
  __n = (ulong)colSettings_local._4_4_;
  std::
  allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>_>
  ::allocator(&local_23);
  std::
  unordered_map<unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>_>_>
  ::unordered_map(&this->matrix_,__n,&local_21,&local_22,&local_23);
  std::
  allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>_>
  ::~allocator(&local_23);
  this->nextInsertIndex_ = 0;
  this->colSettings_ = local_20;
  return;
}

Assistant:

inline Boundary_matrix<Master_matrix>::Boundary_matrix(unsigned int numberOfColumns,
                                                       Column_settings* colSettings)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Swap_opt(numberOfColumns),
      Pair_opt(),
      RA_opt(numberOfColumns),
      matrix_(!Master_matrix::Option_list::has_map_column_container && Master_matrix::Option_list::has_row_access
                  ? 0
                  : numberOfColumns),
      nextInsertIndex_(0),
      colSettings_(colSettings)
{
  if constexpr (!Master_matrix::Option_list::has_map_column_container && Master_matrix::Option_list::has_row_access)
    matrix_.reserve(numberOfColumns);
}